

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

bool testing::internal::String::EndsWithCaseInsensitive(string *str,string *suffix)

{
  ulong uVar1;
  ulong uVar2;
  size_t suffix_len;
  size_t str_len;
  char *in_stack_ffffffffffffffc8;
  undefined1 local_21;
  
  uVar1 = std::__cxx11::string::length();
  uVar2 = std::__cxx11::string::length();
  local_21 = false;
  if (uVar2 <= uVar1) {
    std::__cxx11::string::c_str();
    std::__cxx11::string::c_str();
    local_21 = CaseInsensitiveCStringEquals(in_stack_ffffffffffffffc8,(char *)0x17de63);
  }
  return local_21;
}

Assistant:

bool String::EndsWithCaseInsensitive(
    const std::string& str, const std::string& suffix) {
  const size_t str_len = str.length();
  const size_t suffix_len = suffix.length();
  return (str_len >= suffix_len) &&
         CaseInsensitiveCStringEquals(str.c_str() + str_len - suffix_len,
                                      suffix.c_str());
}